

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_array.c
# Opt level: O3

aspa_status aspa_array_reserve(aspa_array *array,size_t size)

{
  long lVar1;
  aspa_record *paVar2;
  aspa_status aVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aVar3 = ASPA_ERROR;
  if (array != (aspa_array *)0x0) {
    if (array->capacity < size) {
      paVar2 = (aspa_record *)lrtr_realloc(array->data,size * 0x18);
      if (paVar2 == (aspa_record *)0x0) goto LAB_00107e24;
      array->capacity = size;
      array->data = paVar2;
    }
    aVar3 = ASPA_SUCCESS;
  }
LAB_00107e24:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return aVar3;
  }
  __stack_chk_fail();
}

Assistant:

enum aspa_status aspa_array_reserve(struct aspa_array *array, size_t size)
{
	// the given array is null
	if (array == NULL) {
		return ASPA_ERROR;
	}

	// we already have enough space allocated
	if (array->capacity >= size) {
		return ASPA_SUCCESS;
	}

	struct aspa_record *data = lrtr_realloc(array->data, sizeof(struct aspa_record) * size);

	// realloc failed
	if (data == NULL) {
		return ASPA_ERROR;
	}

	// updating the array
	array->capacity = size;
	array->data = data;

	return ASPA_SUCCESS;
}